

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O2

int set_param(char *filename,char *concrete_path)

{
  int iVar1;
  FILE *paramfile;
  
  paramfile = fopen(filename,"r");
  if (paramfile != (FILE *)0x0) {
    if (concrete_path != (char *)0x0) {
      strcpy(concrete_path,filename);
    }
    iVar1 = set_paramptr((FILE *)paramfile);
    return iVar1;
  }
  yprintf(OUTPUT_LV_DEBUG,"Warn: File [%s] is not exist.\n",filename);
  return 0;
}

Assistant:

int set_param(char* filename, char* concrete_path)
{
  FILE* paramfile;
  paramfile = fopen(filename, "r");

  if (!paramfile)
  {
#if HAVE_PKG_CONFIG
    char dir_name[256];
    char file_name[256];
    char* pret;
    FILE* fd;
#endif  // HAVE_PKG_CONFIG

    yprintf(OUTPUT_LV_DEBUG, "Warn: File [%s] is not exist.\n", filename);

#if HAVE_PKG_CONFIG
    if (!strchr(filename, '/'))
    {
      /* ファイルが見つからないとき、かつパス指定でないときshareディレクトリを見に行く
       */
      fd = popen("pkg-config --variable=YP_PARAMS_DIR yp-robot-params", "r");
      if ((fd == NULL))
      {
        yprintf(OUTPUT_LV_ERROR,
                "Error: Cannot open pipe 'pkg-config --variable=YP_PARAMS_DIR yp-robot-params'.\n");
        return 0;
      }
      pret = fgets(dir_name, sizeof(dir_name), fd);

      if ((pclose(fd) == 0) && (pret != 0))
      {
        dir_name[strlen(dir_name) - 1] = '\0';
        // printf( "dir = '%s'\n", dir_name );
        snprintf(file_name, sizeof(file_name), "%s/%s", dir_name, filename);

        paramfile = fopen(file_name, "r");

        if (!paramfile)
        {
          yprintf(OUTPUT_LV_WARNING, "Warn: File [%s] is not exist.\n", file_name);
          return 0;
        }
      }
      else
      {
        yprintf(OUTPUT_LV_ERROR,
                "Error: Cannot read pipe 'pkg-config --variable=YP_PARAMS_DIR yp-robot-params'.\n");
        return 0;
      }
      // fprintf( stdout, "open %s\n", file_name );
      if (concrete_path)
        strcpy(concrete_path, file_name);
      strcpy(file_name, filename);
    }
    else
#endif  // HAVE_PKG_CONFIG
    {
      return 0;
    }
  }
  else
  {
    if (concrete_path)
      strcpy(concrete_path, filename);
  }

  return set_paramptr(paramfile);
}